

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Define.h
# Opt level: O3

Unique<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_> __thiscall
anurbs::
new_<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>const&,anurbs::Interval_const&>
          (anurbs *this,Ref<anurbs::NurbsCurveGeometry<2L>_> *args,Interval *args_1)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  double dVar2;
  undefined8 *puVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  
  puVar3 = (undefined8 *)operator_new(0x28);
  peVar1 = (args->m_entry).
           super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  this_00 = (args->m_entry).
            super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    *puVar3 = &PTR__Curve_00373c40;
    puVar3[1] = peVar1;
    puVar3[2] = 0;
    dVar2 = args_1->m_t1;
    puVar3[3] = args_1->m_t0;
    puVar3[4] = dVar2;
    *(undefined8 **)this = puVar3;
    return (__uniq_ptr_data<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>,_std::default_delete<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>,_true,_true>
            )(__uniq_ptr_data<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>,_std::default_delete<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>,_true,_true>
              )this;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
    bVar4 = __libc_single_threaded == '\0';
    uVar5 = *(undefined4 *)&args_1->m_t0;
    uVar6 = *(undefined4 *)((long)&args_1->m_t0 + 4);
    uVar7 = *(undefined4 *)&args_1->m_t1;
    uVar8 = *(undefined4 *)((long)&args_1->m_t1 + 4);
    *puVar3 = &PTR__Curve_00373c40;
    puVar3[1] = peVar1;
    puVar3[2] = this_00;
    if (bVar4) {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      goto LAB_00213197;
    }
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
    uVar5 = *(undefined4 *)&args_1->m_t0;
    uVar6 = *(undefined4 *)((long)&args_1->m_t0 + 4);
    uVar7 = *(undefined4 *)&args_1->m_t1;
    uVar8 = *(undefined4 *)((long)&args_1->m_t1 + 4);
    *puVar3 = &PTR__Curve_00373c40;
    puVar3[1] = peVar1;
    puVar3[2] = this_00;
  }
  this_00->_M_use_count = this_00->_M_use_count + 1;
LAB_00213197:
  *(undefined4 *)(puVar3 + 3) = uVar5;
  *(undefined4 *)((long)puVar3 + 0x1c) = uVar6;
  *(undefined4 *)(puVar3 + 4) = uVar7;
  *(undefined4 *)((long)puVar3 + 0x24) = uVar8;
  *(undefined8 **)this = puVar3;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return (__uniq_ptr_data<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>,_std::default_delete<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>,_std::default_delete<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>,_true,_true>
            )this;
}

Assistant:

Unique<T> new_(TArgs&&... args)
{
    return Unique<T>(new T(std::forward<TArgs>(args)...));
}